

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_Mesh::SetVertexNormal(ON_Mesh *this,int vertex_index,ON_3dVector *normal)

{
  int iVar1;
  ON_3fVector *pOVar2;
  bool bVar3;
  ON_3fVector v;
  ON_3dVector unit_vector;
  ON_3fVector local_44;
  ON_3dVector local_38;
  
  local_38.z = normal->z;
  local_38.x = normal->x;
  local_38.y = normal->y;
  bVar3 = ON_3dVector::Unitize(&local_38);
  ON_3fVector::ON_3fVector(&local_44,(float)local_38.x,(float)local_38.y,(float)local_38.z);
  if (-1 < vertex_index) {
    iVar1 = (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count;
    if (vertex_index < iVar1) {
      pOVar2 = (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
      pOVar2[(uint)vertex_index].z = local_44.z;
      pOVar2 = pOVar2 + (uint)vertex_index;
      pOVar2->x = local_44.x;
      pOVar2->y = local_44.y;
      return bVar3;
    }
    if (iVar1 == vertex_index) {
      ON_SimpleArray<ON_3fVector>::Append(&(this->m_N).super_ON_SimpleArray<ON_3fVector>,&local_44);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool ON_Mesh::SetVertexNormal(
       int vertex_index,
       const ON_3dVector& normal
       )
{
  bool rc = false;
  // use double precision for unitizing normal
  ON_3dVector unit_vector = normal;
  const bool bUnitVector = unit_vector.Unitize();
  ON_3fVector v((float)unit_vector.x, (float)unit_vector.y, (float)unit_vector.z);
  int normal_count = m_N.Count();
  if ( vertex_index >= 0 ) {
    if ( vertex_index < normal_count ) {
      m_N[vertex_index] = v;
      rc = bUnitVector;
    }
    else if ( vertex_index == normal_count ) {
      m_N.Append(v);
      rc = bUnitVector;
    }
  }
  return rc;
}